

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O3

int readRawYUV(char *filename,uint32_t width,uint32_t height,uint8_t **YUV)

{
  FILE *__stream;
  ulong uVar1;
  uint8_t *__ptr;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    perror("Error opening yuv image for read");
    iVar4 = 1;
  }
  else {
    iVar4 = 2;
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    uVar3 = (height + 1 >> 1) * (width + 1 & 0xfffffffe) + height * width;
    if (uVar3 == (uint)uVar1) {
      iVar4 = 0;
      fseek(__stream,0,0);
      uVar1 = uVar1 & 0xffffffff;
      __ptr = (uint8_t *)malloc(uVar1);
      *YUV = __ptr;
      sVar2 = fread(__ptr,1,uVar1,__stream);
      if (sVar2 != uVar1) {
        perror("Error reading yuv image");
        fclose(__stream);
        return 3;
      }
    }
    else {
      fprintf(_stderr,"Wrong size of yuv image : %d bytes, expected %d bytes\n",uVar1 & 0xffffffff,
              (ulong)uVar3);
    }
    fclose(__stream);
  }
  return iVar4;
}

Assistant:

int readRawYUV(const char *filename, uint32_t width, uint32_t height, uint8_t **YUV)
{
	FILE *fp = fopen(filename, "rb");
	if(!fp)
	{
		perror("Error opening yuv image for read");
		return 1;
	}
	
	// check file size
	fseek(fp, 0, SEEK_END);
	uint32_t size = ftell(fp);
	if(size!=(width*height + 2*((width+1)/2)*((height+1)/2)))
	{
		fprintf(stderr, "Wrong size of yuv image : %d bytes, expected %d bytes\n", size, (width*height + 2*((width+1)/2)*((height+1)/2)));
		fclose(fp);
		return 2;
	}
	fseek(fp, 0, SEEK_SET);
	
	*YUV = malloc(size);
	size_t result = fread(*YUV, 1, size, fp);
	if (result != size) {
		perror("Error reading yuv image");
		fclose(fp);
		return 3;
	}
	fclose(fp);
	return 0;
}